

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall
nuraft::raft_server::on_retryable_req_err(raft_server *this,ptr<peer> *p,ptr<req_msg> *req)

{
  element_type *peVar1;
  peer *this_00;
  bool bVar2;
  int iVar3;
  msg_type type;
  string sStack_78;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_48;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar3 = (*peVar1->_vptr_logger[7])();
    if (4 < iVar3) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_type_to_string_abi_cxx11_
                (&local_48,
                 (nuraft *)
                 (ulong)(((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_msg_base).type_,type);
      msg_if_given_abi_cxx11_
                (&sStack_78,"retry the request %s for %d",local_48._M_dataplus._M_p,
                 (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (*peVar1->_vptr_logger[8])
                (peVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"on_retryable_req_err",0x5e9,&sStack_78);
      std::__cxx11::string::~string((string *)&sStack_78);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  bVar2 = peer::make_busy((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (bVar2) {
    this_00 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,&p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
    peer::send_req(this_00,(ptr<peer> *)&local_58,req,&this->ex_resp_handler_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  }
  else {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar3 = (*peVar1->_vptr_logger[7])();
      if (1 < iVar3) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&sStack_78,"retry request %d failed: peer %d is busy",
                   (ulong)(((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->super_msg_base).type_,
                   (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr)->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_);
        (*peVar1->_vptr_logger[8])
                  (peVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"on_retryable_req_err",0x5ee,&sStack_78);
        std::__cxx11::string::~string((string *)&sStack_78);
      }
    }
  }
  return;
}

Assistant:

void raft_server::on_retryable_req_err(ptr<peer>& p, ptr<req_msg>& req) {
    p_db( "retry the request %s for %d",
          msg_type_to_string(req->get_type()).c_str(), p->get_id() );
    if (p->make_busy()) {
        p->send_req(p, req, ex_resp_handler_);
    } else {
        p_er("retry request %d failed: peer %d is busy",
             req->get_type(), p->get_id());
    }
}